

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::queryMarketDataRequest(Application *this)

{
  int iVar1;
  ostream *poVar2;
  Message md;
  allocator<char> local_2c1;
  MarketDataRequest local_2c0;
  Message local_168 [344];
  
  iVar1 = queryVersion(this);
  std::operator<<((ostream *)&std::cout,"\nMarketDataRequest\n");
  FIX::Message::Message(local_168);
  if (iVar1 == 0x32) {
    queryMarketDataRequest50((MarketDataRequest *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
  }
  else if (iVar1 == 0x2c) {
    queryMarketDataRequest44((MarketDataRequest *)&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
  }
  else {
    if (iVar1 != 0x2b) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"No test for version ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_0011b06a;
    }
    queryMarketDataRequest43(&local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)&local_2c0);
  }
  FIX::Message::~Message((Message *)&local_2c0);
LAB_0011b06a:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_2c1);
  FIX::Session::sendToTarget(local_168,(string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

void Application::queryMarketDataRequest() {
  int version = queryVersion();
  std::cout << "\nMarketDataRequest\n";
  FIX::Message md;

  switch (version) {
  case 43:
    md = queryMarketDataRequest43();
    break;
  case 44:
    md = queryMarketDataRequest44();
    break;
  case 50:
    md = queryMarketDataRequest50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  FIX::Session::sendToTarget(md);
}